

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O0

QDebug operator<<(QDebug *debug,QSharedPointer<char> *ptr)

{
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  QDebug *in_stack_ffffffffffffffa8;
  undefined8 local_10;
  char *t;
  
  t = *(char **)(in_FS_OFFSET + 0x28);
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_10,(QDebug *)in_RSI);
  QDebug::nospace(in_RSI);
  QDebug::operator<<(in_RSI,t);
  QSharedPointer<char>::data((QSharedPointer<char> *)0x1abead);
  QDebug::operator<<(in_RSI,t);
  QDebug::operator<<(in_RSI,t);
  QDebug::QDebug((QDebug *)in_RDI,in_stack_ffffffffffffffa8);
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_10);
  if (*(char **)(in_FS_OFFSET + 0x28) == t) {
    return (QDebug)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug operator<<(QDebug debug, const QSharedPointer<T> &ptr)
{
    QDebugStateSaver saver(debug);
    debug.nospace() << "QSharedPointer(" << ptr.data() << ")";
    return debug;
}